

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_send(Curl_easy *data,size_t len,size_t upload_size)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  size_t bytes_written;
  size_t local_20;
  
  pcVar1 = data->conn;
  CVar2 = Curl_xfer_send(data,(pcVar1->proto).smbc.send_buf,len,false,&local_20);
  if (CVar2 == CURLE_OK) {
    if (local_20 != len) {
      (pcVar1->proto).ftpc.pp.sendbuf.leng = len;
      (pcVar1->proto).ftpc.pp.sendbuf.allc = local_20;
    }
    (pcVar1->proto).ftpc.pp.sendbuf.bufr = (char *)upload_size;
  }
  return CVar2;
}

Assistant:

static CURLcode smb_send(struct Curl_easy *data, size_t len,
                         size_t upload_size)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  size_t bytes_written;
  CURLcode result;

  result = Curl_xfer_send(data, smbc->send_buf, len, FALSE, &bytes_written);
  if(result)
    return result;

  if(bytes_written != len) {
    smbc->send_size = len;
    smbc->sent = bytes_written;
  }

  smbc->upload_size = upload_size;

  return CURLE_OK;
}